

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::clear(QMenu *this)

{
  pointer ppQVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  QList<QAction_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::actions(&local_38,&this->super_QWidget);
  if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
    puVar2 = (undefined1 *)0x0;
    do {
      ppQVar1 = QList<QAction_*>::data(&local_38);
      QWidget::removeAction(&this->super_QWidget,ppQVar1[(long)puVar2]);
      ppQVar1 = QList<QAction_*>::data(&local_38);
      if (*(QMenu **)(*(long *)(ppQVar1[(long)puVar2] + 8) + 0x10) == this) {
        ppQVar1 = QList<QAction_*>::data(&local_38);
        if (*(long *)(*(long *)(ppQVar1[(long)puVar2] + 8) + 0x150) == 0) {
          ppQVar1 = QList<QAction_*>::data(&local_38);
          if (ppQVar1[(long)puVar2] != (QAction *)0x0) {
            (**(code **)(*(long *)ppQVar1[(long)puVar2] + 0x20))();
          }
        }
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 < (ulong)local_38.d.size);
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::clear()
{
    QList<QAction*> acts = actions();

    for(int i = 0; i < acts.size(); i++) {
        removeAction(acts[i]);
        if (acts[i]->parent() == this && acts[i]->d_func()->associatedObjects.isEmpty())
            delete acts[i];
    }
}